

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

uint64_t __thiscall
FIX::double_conversion::ReadUint64
          (double_conversion *this,Vector<const_char> buffer,int *number_of_read_digits)

{
  int iVar1;
  char *pcVar2;
  bool local_39;
  int local_2c;
  int digit;
  int i;
  uint64_t result;
  int *number_of_read_digits_local;
  Vector<const_char> buffer_local;
  
  buffer_local.start_._0_4_ = buffer.start_._0_4_;
  _digit = 0;
  local_2c = 0;
  number_of_read_digits_local = (int *)this;
  while( true ) {
    iVar1 = Vector<const_char>::length((Vector<const_char> *)&number_of_read_digits_local);
    if (iVar1 <= local_2c || 0x1999999999999998 < _digit) {
      *buffer._8_8_ = local_2c;
      return _digit;
    }
    pcVar2 = Vector<const_char>::operator[]
                       ((Vector<const_char> *)&number_of_read_digits_local,local_2c);
    local_39 = 9 < (int)*pcVar2 - 0x30U;
    if (local_39) break;
    _digit = _digit * 10 + (long)(int)((int)*pcVar2 - 0x30U);
    local_2c = local_2c + 1;
  }
  __assert_fail("0 <= digit && digit <= 9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                ,0xa4,"uint64_t FIX::double_conversion::ReadUint64(Vector<const char>, int *)");
}

Assistant:

static uint64_t ReadUint64(Vector<const char> buffer,
                           int* number_of_read_digits) {
  uint64_t result = 0;
  int i = 0;
  while (i < buffer.length() && result <= (kMaxUint64 / 10 - 1)) {
    int digit = buffer[i++] - '0';
    ASSERT(0 <= digit && digit <= 9);
    result = 10 * result + digit;
  }
  *number_of_read_digits = i;
  return result;
}